

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

void google::protobuf::internal::TcParser::VerifyHasBitConsistency
               (MessageLite *msg,TcParseTableBase *table)

{
  ushort uVar1;
  uint uVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  Nonnull<const_char_*> pcVar5;
  ulong uVar6;
  size_t size_to_compare;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2;
  pointer pcVar7;
  uint *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v1;
  pointer pcVar9;
  uint *puVar10;
  short *in_RSI;
  pointer in_RDI;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  undefined1 auVar14 [16];
  anon_class_24_3_63b2e8fc print_error;
  LogMessage LStack_88;
  string local_78;
  short *local_58;
  pointer *local_50;
  short **local_48;
  uint *local_40;
  pointer local_38;
  
  if ((*in_RSI != 0) && (in_RSI[10] != 0)) {
    puVar12 = (uint *)((ulong)*(uint *)(in_RSI + 8) + (long)in_RSI);
    lVar13 = (ulong)(ushort)in_RSI[10] * 0xc;
    local_58 = in_RSI;
    local_38 = in_RDI;
    do {
      local_48 = &local_58;
      uVar1 = *(ushort *)((long)puVar12 + 10);
      if ((uVar1 & 0x30) != 0x10) {
        return;
      }
      local_50 = &local_38;
      local_40 = puVar12;
      if (((ulong)(local_38 + (ulong)(puVar12[1] >> 5) * 4) & 3) != 0) {
        AlignFail();
      }
      uVar11 = 1 << ((byte)puVar12[1] & 0x1f) & *(uint *)(local_38 + (ulong)(puVar12[1] >> 5) * 4);
      pcVar7 = (pointer)**(long **)(local_58 + 0x10);
      pcVar9 = local_38;
      if ((uVar1 & 8) != 0) {
        uVar2 = *(uint *)((ulong)*(uint *)(local_58 + 0xc) + 8 + (long)local_58);
        v1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_38 + uVar2)
        ;
        if (((ulong)v1 & 7) != 0) goto LAB_00441bfc;
        v2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pcVar7 + uVar2);
        if (((ulong)v2 & 7) != 0) goto LAB_00441c04;
        pcVar9 = (v1->_M_dataplus)._M_p;
        pcVar7 = (v2->_M_dataplus)._M_p;
      }
      switch(uVar1 & 7) {
      case 1:
      case 3:
        if (uVar11 != 0) {
          return;
        }
        if ((uVar1 & 0x1c0) == 0xc0) {
          v1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pcVar9 + *puVar12);
          if (((ulong)v1 & 7) != 0) goto LAB_00441bfc;
          v2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pcVar7 + *puVar12);
          if (((ulong)v2 & 7) != 0) goto LAB_00441c04;
          pcVar7 = (v1->_M_dataplus)._M_p;
          pcVar9 = (v2->_M_dataplus)._M_p;
          if (pcVar7 == pcVar9) {
            pcVar5 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar5 = absl::lts_20250127::log_internal::
                     MakeCheckOpString<unsigned_long,unsigned_long>
                               ((unsigned_long)pcVar7,(unsigned_long)pcVar9,
                                "RefAt<uint64_t>(base, entry.offset) == RefAt<uint64_t>(default_base, entry.offset)"
                               );
          }
          if (pcVar5 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&LStack_88,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x7d,pcVar5);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_78,&local_50);
            absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_88,&local_78);
            goto LAB_00441d98;
          }
        }
        else if ((uVar1 & 0x1c0) == 0x80) {
          puVar10 = (uint *)(pcVar9 + *puVar12);
          if (((ulong)puVar10 & 3) != 0) {
            AlignFail(puVar10);
          }
          puVar8 = (uint *)(pcVar7 + *puVar12);
          if (((ulong)puVar8 & 3) != 0) {
            AlignFail(puVar8);
          }
          if (*puVar10 == *puVar8) {
            pcVar5 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               ((ulong)*puVar10,(ulong)*puVar8,
                                "RefAt<uint32_t>(base, entry.offset) == RefAt<uint32_t>(default_base, entry.offset)"
                               );
          }
          if (pcVar5 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&LStack_88,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x78,pcVar5);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_78,&local_50);
            absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_88,&local_78);
LAB_00441d98:
            std::__cxx11::string::~string((string *)&local_78);
            goto LAB_00441de8;
          }
        }
        else if ((uVar1 & 0x1c0) == 0) {
          if (pcVar9[*puVar12] == pcVar7[*puVar12]) {
            pcVar5 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                               ((bool)pcVar9[*puVar12],(bool)pcVar7[*puVar12],
                                "RefAt<bool>(base, entry.offset) == RefAt<bool>(default_base, entry.offset)"
                               );
          }
          if (pcVar5 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&LStack_88,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x73,pcVar5);
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_78,&local_50);
            absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_88,&local_78);
            goto LAB_00441d98;
          }
        }
        break;
      default:
        VerifyHasBitConsistency();
LAB_00441da9:
        VerifyHasBitConsistency();
switchD_0044193f_caseD_4:
        VerifyHasBitConsistency();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
LAB_00441de8:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&LStack_88);
      case 5:
        switch(uVar1 >> 6 & 7) {
        case 0:
          if (uVar11 != 0) {
            v1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pcVar9 + *puVar12);
            if (((ulong)v1 & 7) != 0) {
LAB_00441bfc:
              AlignFail(v1);
            }
            if (((ulong)(v1->_M_dataplus)._M_p & 3) == 0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&LStack_88,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                         ,0x88,"!RefAt<ArenaStringPtr>(base, entry.offset).IsDefault()");
              VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
              ::$_0::operator()[abi_cxx11_(&local_78,&local_50);
              absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_88,&local_78);
              goto LAB_00441d98;
            }
          }
          break;
        case 1:
          if (uVar11 == 0) {
            v1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pcVar9 + *puVar12);
            if (((ulong)v1 & 7) != 0) goto LAB_00441bfc;
            v2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pcVar7 + *puVar12);
            if (((ulong)v2 & 7) != 0) {
LAB_00441c04:
              AlignFail(v2);
            }
            __n = v1->_M_string_length;
            if ((__n == v2->_M_string_length) &&
               ((__n == 0 ||
                (iVar4 = bcmp((v1->_M_dataplus)._M_p,(v2->_M_dataplus)._M_p,__n), iVar4 == 0)))) {
              pcVar5 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar5 = absl::lts_20250127::log_internal::
                       MakeCheckOpString<std::__cxx11::string_const&,std::__cxx11::string_const&>
                                 (v1,v2,
                                  "RefAt<InlinedStringField>(base, entry.offset).Get() == RefAt<InlinedStringField>(default_base, entry.offset).Get()"
                                 );
            }
            if (pcVar5 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&LStack_88,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                         ,0x9d,pcVar5);
              VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
              ::$_0::operator()[abi_cxx11_(&local_78,&local_50);
              absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_88,&local_78);
              goto LAB_00441d98;
            }
          }
          break;
        case 2:
          if (uVar11 == 0) {
            v1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pcVar9 + *puVar12);
            if (((ulong)v1 & 7) != 0) goto LAB_00441bfc;
            v2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pcVar7 + *puVar12);
            if (((ulong)v2 & 7) != 0) goto LAB_00441c04;
            auVar14[0] = -(*(char *)&(v2->_M_dataplus)._M_p == *(char *)&(v1->_M_dataplus)._M_p);
            auVar14[1] = -(*(char *)((long)&(v2->_M_dataplus)._M_p + 1) ==
                          *(char *)((long)&(v1->_M_dataplus)._M_p + 1));
            auVar14[2] = -(*(char *)((long)&(v2->_M_dataplus)._M_p + 2) ==
                          *(char *)((long)&(v1->_M_dataplus)._M_p + 2));
            auVar14[3] = -(*(char *)((long)&(v2->_M_dataplus)._M_p + 3) ==
                          *(char *)((long)&(v1->_M_dataplus)._M_p + 3));
            auVar14[4] = -(*(char *)((long)&(v2->_M_dataplus)._M_p + 4) ==
                          *(char *)((long)&(v1->_M_dataplus)._M_p + 4));
            auVar14[5] = -(*(char *)((long)&(v2->_M_dataplus)._M_p + 5) ==
                          *(char *)((long)&(v1->_M_dataplus)._M_p + 5));
            auVar14[6] = -(*(char *)((long)&(v2->_M_dataplus)._M_p + 6) ==
                          *(char *)((long)&(v1->_M_dataplus)._M_p + 6));
            auVar14[7] = -(*(char *)((long)&(v2->_M_dataplus)._M_p + 7) ==
                          *(char *)((long)&(v1->_M_dataplus)._M_p + 7));
            auVar14[8] = -((char)v2->_M_string_length == (char)v1->_M_string_length);
            auVar14[9] = -(*(char *)((long)&v2->_M_string_length + 1) ==
                          *(char *)((long)&v1->_M_string_length + 1));
            auVar14[10] = -(*(char *)((long)&v2->_M_string_length + 2) ==
                           *(char *)((long)&v1->_M_string_length + 2));
            auVar14[0xb] = -(*(char *)((long)&v2->_M_string_length + 3) ==
                            *(char *)((long)&v1->_M_string_length + 3));
            auVar14[0xc] = -(*(char *)((long)&v2->_M_string_length + 4) ==
                            *(char *)((long)&v1->_M_string_length + 4));
            auVar14[0xd] = -(*(char *)((long)&v2->_M_string_length + 5) ==
                            *(char *)((long)&v1->_M_string_length + 5));
            auVar14[0xe] = -(*(char *)((long)&v2->_M_string_length + 6) ==
                            *(char *)((long)&v1->_M_string_length + 6));
            auVar14[0xf] = -(*(char *)((long)&v2->_M_string_length + 7) ==
                            *(char *)((long)&v1->_M_string_length + 7));
            if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
              pcVar5 = (Nonnull<const_char_*>)0x0;
            }
            else {
              uVar6 = (ulong)*(char *)&(v2->_M_dataplus)._M_p;
              if ((uVar6 & 1) == 0) {
                size_to_compare = uVar6 >> 1;
              }
              else {
                size_to_compare = *(size_t *)v2->_M_string_length;
              }
              uVar6 = (ulong)*(char *)&(v1->_M_dataplus)._M_p;
              if ((uVar6 & 1) == 0) {
                uVar6 = uVar6 >> 1;
              }
              else {
                uVar6 = *(ulong *)v1->_M_string_length;
              }
              if ((uVar6 == size_to_compare) &&
                 (bVar3 = absl::lts_20250127::Cord::EqualsImpl
                                    ((Cord *)v1,(Cord *)v2,size_to_compare), bVar3)) {
                pcVar5 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar5 = absl::lts_20250127::log_internal::
                         MakeCheckOpString<absl::lts_20250127::Cord_const&,absl::lts_20250127::Cord_const&>
                                   ((Cord *)v1,(Cord *)v2,
                                    "RefAt<absl::Cord>(base, entry.offset) == RefAt<absl::Cord>(default_base, entry.offset)"
                                   );
              }
            }
            if (pcVar5 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&LStack_88,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                         ,0x94,pcVar5);
              VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
              ::$_0::operator()[abi_cxx11_(&local_78,&local_50);
              absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_88,&local_78);
              goto LAB_00441d98;
            }
          }
          break;
        case 4:
          goto switchD_0044193f_caseD_4;
        }
        break;
      case 6:
        if ((uVar1 & 0x180) != 0) goto LAB_00441da9;
        if (uVar11 != 0) {
          v1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pcVar9 + *puVar12);
          if (((ulong)v1 & 7) != 0) goto LAB_00441bfc;
          if ((v1->_M_dataplus)._M_p == (pointer)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&LStack_88,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0xab,"RefAt<const MessageLite*>(base, entry.offset) != nullptr");
            VerifyHasBitConsistency(google::protobuf::MessageLite_const*,google::protobuf::internal::TcParseTableBase_const*)
            ::$_0::operator()[abi_cxx11_(&local_78,&local_50);
            absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_88,&local_78);
            goto LAB_00441d98;
          }
        }
      }
      puVar12 = puVar12 + 3;
      lVar13 = lVar13 + -0xc;
    } while (lVar13 != 0);
  }
  return;
}

Assistant:

void TcParser::VerifyHasBitConsistency(const MessageLite* msg,
                                       const TcParseTableBase* table) {
  namespace fl = internal::field_layout;
  if (table->has_bits_offset == 0) {
    // Nothing to check
    return;
  }

  for (const auto& entry : table->field_entries()) {
    const auto print_error = [&] {
      return absl::StrFormat("Type=%s Field=%d\n", msg->GetTypeName(),
                             FieldNumber(table, &entry));
    };
    if ((entry.type_card & fl::kFcMask) != fl::kFcOptional) return;
    const bool has_bit = ReadHas(entry, msg);
    const void* base = msg;
    const void* default_base = table->default_instance();
    if ((entry.type_card & field_layout::kSplitMask) ==
        field_layout::kSplitTrue) {
      const size_t offset = table->field_aux(kSplitOffsetAuxIdx)->offset;
      base = TcParser::RefAt<const void*>(base, offset);
      default_base = TcParser::RefAt<const void*>(default_base, offset);
    }
    switch (entry.type_card & fl::kFkMask) {
      case fl::kFkVarint:
      case fl::kFkFixed:
        // Numerics can have any value when the has bit is on.
        if (has_bit) return;
        switch (entry.type_card & fl::kRepMask) {
          case fl::kRep8Bits:
            ABSL_CHECK_EQ(RefAt<bool>(base, entry.offset),
                          RefAt<bool>(default_base, entry.offset))
                << print_error();
            break;
          case fl::kRep32Bits:
            ABSL_CHECK_EQ(RefAt<uint32_t>(base, entry.offset),
                          RefAt<uint32_t>(default_base, entry.offset))
                << print_error();
            break;
          case fl::kRep64Bits:
            ABSL_CHECK_EQ(RefAt<uint64_t>(base, entry.offset),
                          RefAt<uint64_t>(default_base, entry.offset))
                << print_error();
            break;
        }
        break;

      case fl::kFkString:
        switch (entry.type_card & fl::kRepMask) {
          case field_layout::kRepAString:
            if (has_bit) {
              // Must not point to the default.
              ABSL_CHECK(!RefAt<ArenaStringPtr>(base, entry.offset).IsDefault())
                  << print_error();
            } else {
              // We should technically check that the value matches the default
              // value of the field, but the prototype does not actually contain
              // this value. Non-empty defaults are loaded on access.
            }
            break;
          case field_layout::kRepCord:
            if (!has_bit) {
              // If the has bit is off, it must match the default.
              ABSL_CHECK_EQ(RefAt<absl::Cord>(base, entry.offset),
                            RefAt<absl::Cord>(default_base, entry.offset))
                  << print_error();
            }
            break;
          case field_layout::kRepIString:
            if (!has_bit) {
              // If the has bit is off, it must match the default.
              ABSL_CHECK_EQ(
                  RefAt<InlinedStringField>(base, entry.offset).Get(),
                  RefAt<InlinedStringField>(default_base, entry.offset).Get())
                  << print_error();
            }
            break;
          case field_layout::kRepSString:
            Unreachable();
        }
        break;
      case fl::kFkMessage:
        switch (entry.type_card & fl::kRepMask) {
          case fl::kRepMessage:
          case fl::kRepGroup:
            if (has_bit) {
              ABSL_CHECK(RefAt<const MessageLite*>(base, entry.offset) !=
                         nullptr)
                  << print_error();
            } else {
              // An off has_bit does not imply a null pointer.
              // We might have a previous instance that we cached.
            }
            break;
          default:
            Unreachable();
        }
        break;

      default:
        // All other types are not `optional`.
        Unreachable();
    }
  }
}